

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_compressStream_generic
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  size_t *psVar1;
  byte *pbVar2;
  uint uVar3;
  ZSTDMT_jobDescription *pZVar4;
  void *pvVar5;
  ZSTD_CDict *cdict;
  U64 UVar6;
  buffer_t buffer;
  uint uVar7;
  int iVar8;
  ZSTD_EndDirective ZVar9;
  U64 UVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  ZSTD_CCtx_params *pZVar15;
  undefined8 *puVar16;
  size_t __n;
  size_t sVar17;
  byte *pbVar18;
  ulong uVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong size;
  bool bVar24;
  buffer_t buffer_00;
  buffer_t buffer_01;
  buffer_t buffer_02;
  range_t range;
  range_t range_00;
  buffer_t buffer_03;
  ZSTD_CCtx_params in_stack_ffffffffffffff08;
  BYTE *local_58;
  
  uVar22 = output->pos;
  sVar13 = output->size - uVar22;
  if (output->size < uVar22) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5234,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  uVar12 = input->size;
  uVar21 = input->pos;
  sVar17 = uVar12 - uVar21;
  if (uVar12 < uVar21) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5235,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if (mtctx->singleBlockingThread != 0) {
    sVar13 = ZSTD_compressStream2(mtctx->cctxPool->cctx[0],output,input,endOp);
    return sVar13;
  }
  if ((endOp == ZSTD_e_continue) && (mtctx->frameEnded != 0)) {
    return 0xffffffffffffffc4;
  }
  iVar8 = (mtctx->params).rsyncable;
  if ((((iVar8 == 0) && (mtctx->nextJobID == 0)) && ((mtctx->inBuff).filled == 0)) &&
     ((endOp == ZSTD_e_end && (mtctx->jobReady == 0)))) {
    uVar19 = 0;
    if (sVar17 < 0x20000) {
      uVar19 = (ulong)(0x20000U - (int)sVar17 >> 0xb);
    }
    if (uVar19 + (sVar17 >> 8) + sVar17 <= sVar13) {
      pvVar20 = output->dst;
      pvVar5 = input->src;
      cdict = mtctx->cdict;
      pZVar15 = &mtctx->params;
      puVar16 = (undefined8 *)&stack0xffffffffffffff08;
      for (lVar11 = 0x12; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar16 = *(undefined8 *)pZVar15;
        pZVar15 = (ZSTD_CCtx_params *)&(pZVar15->cParams).chainLog;
        puVar16 = puVar16 + 1;
      }
      sVar13 = ZSTDMT_compress_advanced_internal
                         (mtctx,(void *)(uVar22 + (long)pvVar20),sVar13,
                          (void *)(uVar21 + (long)pvVar5),sVar17,cdict,in_stack_ffffffffffffff08);
      if (0xffffffffffffff88 < sVar13) {
        return sVar13;
      }
      input->pos = input->size;
      output->pos = output->pos + sVar13;
      mtctx->frameEnded = 1;
      mtctx->allJobsCompleted = 1;
      return 0;
    }
  }
  if (mtctx->jobReady == 0) {
    if (uVar21 < uVar12) {
      buffer_01.start = (BYTE *)(mtctx->inBuff).buffer.start;
      if (buffer_01.start == (BYTE *)0x0) {
        if ((mtctx->inBuff).filled != 0) {
          __assert_fail("mtctx->inBuff.filled == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5257,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        uVar14 = mtctx->doneJobID;
        uVar3 = mtctx->nextJobID;
        do {
          pvVar20 = (void *)0x0;
          if (uVar3 <= uVar14) {
            uVar22 = 0;
            goto LAB_0013f4ff;
          }
          uVar7 = mtctx->jobIDMask & uVar14;
          pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar7].job_mutex);
          uVar12 = mtctx->jobs[uVar7].consumed;
          pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar7].job_mutex);
          pZVar4 = mtctx->jobs;
          uVar22 = pZVar4[uVar7].src.size;
          uVar14 = uVar14 + 1;
        } while (uVar22 <= uVar12);
        uVar12 = pZVar4[uVar7].prefix.size;
        if (uVar12 != 0) {
          uVar22 = uVar12;
        }
        pvVar20 = (&pZVar4[uVar7].prefix)[uVar12 == 0].start;
        if (pZVar4[uVar7].src.start < pvVar20) {
          __assert_fail("range.start <= mtctx->jobs[wJobID].src.start",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5157,"range_t ZSTDMT_getInputDataInUse(ZSTDMT_CCtx *)");
        }
LAB_0013f4ff:
        if ((mtctx->inBuff).buffer.start != (void *)0x0) {
          __assert_fail("mtctx->inBuff.buffer.start == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x51a6,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
        }
        uVar12 = mtctx->targetSectionSize;
        uVar21 = (mtctx->roundBuff).capacity;
        if (uVar21 < uVar12) {
          __assert_fail("mtctx->roundBuff.capacity >= target",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x51a7,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
        }
        __n = (mtctx->roundBuff).pos;
        if (uVar21 - __n < uVar12) {
          __n = (mtctx->inBuff).prefix.size;
          buffer_01.start = (mtctx->roundBuff).buffer;
          buffer_00.capacity = __n;
          buffer_00.start = buffer_01.start;
          range.size = uVar22;
          range.start = pvVar20;
          iVar8 = ZSTDMT_isOverlapped(buffer_00,range);
          if (iVar8 == 0) {
            buffer.capacity = __n;
            buffer.start = buffer_01.start;
            ZSTDMT_waitForLdmComplete(mtctx,buffer);
            memmove(buffer_01.start,(mtctx->inBuff).prefix.start,__n);
            (mtctx->inBuff).prefix.start = buffer_01.start;
            (mtctx->roundBuff).pos = __n;
            goto LAB_0013f5d2;
          }
LAB_0013f5eb:
          if (mtctx->doneJobID == mtctx->nextJobID) {
            __assert_fail("mtctx->doneJobID != mtctx->nextJobID",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x525d,
                          "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                         );
          }
          buffer_01.start = (BYTE *)(mtctx->inBuff).buffer.start;
        }
        else {
LAB_0013f5d2:
          buffer_01.start = (mtctx->roundBuff).buffer + __n;
          buffer_01.capacity = uVar12;
          range_00.size = uVar22;
          range_00.start = pvVar20;
          iVar8 = ZSTDMT_isOverlapped(buffer_01,range_00);
          if (iVar8 != 0) goto LAB_0013f5eb;
          buffer_02.capacity = uVar12;
          buffer_02.start = buffer_01.start;
          iVar8 = ZSTDMT_isOverlapped(buffer_02,(mtctx->inBuff).prefix);
          if (iVar8 != 0) {
            __assert_fail("!ZSTDMT_isOverlapped(buffer, mtctx->inBuff.prefix)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x51c2,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
          }
          buffer_03.capacity = uVar12;
          buffer_03.start = buffer_01.start;
          ZSTDMT_waitForLdmComplete(mtctx,buffer_03);
          (mtctx->inBuff).buffer.start = buffer_01.start;
          (mtctx->inBuff).buffer.capacity = uVar12;
          (mtctx->inBuff).filled = 0;
          if ((mtctx->roundBuff).capacity < uVar12 + (mtctx->roundBuff).pos) {
            __assert_fail("mtctx->roundBuff.pos + buffer.capacity <= mtctx->roundBuff.capacity",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x51d0,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
          }
        }
        uVar12 = input->size;
        uVar21 = input->pos;
        if (buffer_01.start != (BYTE *)0x0) {
          iVar8 = (mtctx->params).rsyncable;
          goto LAB_0013f67c;
        }
        uVar14 = 1;
      }
      else {
LAB_0013f67c:
        pvVar20 = (void *)(uVar21 + (long)input->src);
        uVar22 = mtctx->targetSectionSize;
        uVar19 = (mtctx->inBuff).filled;
        uVar23 = uVar22 - uVar19;
        if (uVar12 - uVar21 < uVar23) {
          uVar23 = uVar12 - uVar21;
        }
        uVar12 = uVar23;
        bVar24 = false;
        if ((iVar8 != 0) && (bVar24 = false, 0x1f < uVar19 + uVar23)) {
          UVar6 = (mtctx->rsync).primePower;
          uVar21 = (mtctx->rsync).hitMask;
          if (uVar19 < 0x20) {
            size = 0x20 - uVar19;
            local_58 = buffer_01.start + (uVar19 - 0x20);
            UVar10 = ZSTD_rollingHash_compute(buffer_01.start,uVar19);
            UVar10 = ZSTD_rollingHash_append(UVar10,pvVar20,size);
          }
          else {
            local_58 = buffer_01.start + (uVar19 - 0x20);
            UVar10 = ZSTD_rollingHash_compute(local_58,0x20);
            size = 0;
          }
          do {
            bVar24 = size < uVar23;
            uVar12 = uVar23;
            if (!bVar24) break;
            pbVar2 = (byte *)((long)pvVar20 + (size - 0x20));
            pbVar18 = local_58 + size;
            if (0x1f < size) {
              pbVar18 = pbVar2;
            }
            UVar10 = (UVar10 - ((ulong)*pbVar18 + 10) * UVar6) * -0x30e44323485a9b9d +
                     (ulong)pbVar2[0x20] + 10;
            size = size + 1;
            uVar12 = size;
          } while ((uVar21 & ~UVar10) != 0);
        }
        if ((mtctx->inBuff).buffer.capacity < uVar22) {
          __assert_fail("mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5266,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        ZVar9 = ZSTD_e_flush;
        if (!bVar24) {
          ZVar9 = endOp;
        }
        if (endOp == ZSTD_e_continue) {
          endOp = ZVar9;
        }
        memcpy(buffer_01.start + uVar19,pvVar20,uVar12);
        uVar21 = input->pos + uVar12;
        input->pos = uVar21;
        psVar1 = &(mtctx->inBuff).filled;
        *psVar1 = *psVar1 + uVar12;
        uVar14 = (uint)(uVar12 == 0);
        uVar12 = input->size;
      }
      ZVar9 = ZSTD_e_flush;
      if (uVar12 <= uVar21) {
        ZVar9 = endOp;
      }
      if (endOp == ZSTD_e_end) {
        endOp = ZVar9;
      }
      if (mtctx->jobReady != 0) goto LAB_0013f309;
    }
    else {
      uVar14 = 1;
    }
    uVar22 = (mtctx->inBuff).filled;
    if (((uVar22 < mtctx->targetSectionSize) && (endOp == ZSTD_e_continue || uVar22 == 0)) &&
       ((endOp != ZSTD_e_end || (endOp = ZSTD_e_end, mtctx->frameEnded != 0)))) goto LAB_0013f327;
  }
  else {
    uVar14 = 1;
  }
LAB_0013f309:
  sVar13 = (mtctx->inBuff).filled;
  if (mtctx->targetSectionSize < sVar13) {
    __assert_fail("mtctx->inBuff.filled <= mtctx->targetSectionSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5277,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  ZSTDMT_createCompressionJob(mtctx,sVar13,endOp);
LAB_0013f327:
  sVar17 = ZSTDMT_flushProduced(mtctx,output,uVar14,endOp);
  sVar13 = sVar17 + (sVar17 == 0);
  if (input->size <= input->pos) {
    sVar13 = sVar17;
  }
  return sVar13;
}

Assistant:

size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx* mtctx,
                                     ZSTD_outBuffer* output,
                                     ZSTD_inBuffer* input,
                                     ZSTD_EndDirective endOp)
{
    unsigned forwardInputProgress = 0;
    DEBUGLOG(5, "ZSTDMT_compressStream_generic (endOp=%u, srcSize=%u)",
                (U32)endOp, (U32)(input->size - input->pos));
    assert(output->pos <= output->size);
    assert(input->pos  <= input->size);

    if (mtctx->singleBlockingThread) {  /* delegate to single-thread (synchronous) */
        return ZSTD_compressStream2(mtctx->cctxPool->cctx[0], output, input, endOp);
    }

    if ((mtctx->frameEnded) && (endOp==ZSTD_e_continue)) {
        /* current frame being ended. Only flush/end are allowed */
        return ERROR(stage_wrong);
    }

    /* single-pass shortcut (note : synchronous-mode) */
    if ( (!mtctx->params.rsyncable)   /* rsyncable mode is disabled */
      && (mtctx->nextJobID == 0)      /* just started */
      && (mtctx->inBuff.filled == 0)  /* nothing buffered */
      && (!mtctx->jobReady)           /* no job already created */
      && (endOp == ZSTD_e_end)        /* end order */
      && (output->size - output->pos >= ZSTD_compressBound(input->size - input->pos)) ) { /* enough space in dst */
        size_t const cSize = ZSTDMT_compress_advanced_internal(mtctx,
                (char*)output->dst + output->pos, output->size - output->pos,
                (const char*)input->src + input->pos, input->size - input->pos,
                mtctx->cdict, mtctx->params);
        if (ZSTD_isError(cSize)) return cSize;
        input->pos = input->size;
        output->pos += cSize;
        mtctx->allJobsCompleted = 1;
        mtctx->frameEnded = 1;
        return 0;
    }

    /* fill input buffer */
    if ( (!mtctx->jobReady)
      && (input->size > input->pos) ) {   /* support NULL input */
        if (mtctx->inBuff.buffer.start == NULL) {
            assert(mtctx->inBuff.filled == 0); /* Can't fill an empty buffer */
            if (!ZSTDMT_tryGetInputRange(mtctx)) {
                /* It is only possible for this operation to fail if there are
                 * still compression jobs ongoing.
                 */
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange failed");
                assert(mtctx->doneJobID != mtctx->nextJobID);
            } else
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange completed successfully : mtctx->inBuff.buffer.start = %p", mtctx->inBuff.buffer.start);
        }
        if (mtctx->inBuff.buffer.start != NULL) {
            syncPoint_t const syncPoint = findSynchronizationPoint(mtctx, *input);
            if (syncPoint.flush && endOp == ZSTD_e_continue) {
                endOp = ZSTD_e_flush;
            }
            assert(mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize);
            DEBUGLOG(5, "ZSTDMT_compressStream_generic: adding %u bytes on top of %u to buffer of size %u",
                        (U32)syncPoint.toLoad, (U32)mtctx->inBuff.filled, (U32)mtctx->targetSectionSize);
            memcpy((char*)mtctx->inBuff.buffer.start + mtctx->inBuff.filled, (const char*)input->src + input->pos, syncPoint.toLoad);
            input->pos += syncPoint.toLoad;
            mtctx->inBuff.filled += syncPoint.toLoad;
            forwardInputProgress = syncPoint.toLoad>0;
        }
        if ((input->pos < input->size) && (endOp == ZSTD_e_end))
            endOp = ZSTD_e_flush;   /* can't end now : not all input consumed */
    }

    if ( (mtctx->jobReady)
      || (mtctx->inBuff.filled >= mtctx->targetSectionSize)  /* filled enough : let's compress */
      || ((endOp != ZSTD_e_continue) && (mtctx->inBuff.filled > 0))  /* something to flush : let's go */
      || ((endOp == ZSTD_e_end) && (!mtctx->frameEnded)) ) {   /* must finish the frame with a zero-size block */
        size_t const jobSize = mtctx->inBuff.filled;
        assert(mtctx->inBuff.filled <= mtctx->targetSectionSize);
        FORWARD_IF_ERROR( ZSTDMT_createCompressionJob(mtctx, jobSize, endOp) );
    }

    /* check for potential compressed data ready to be flushed */
    {   size_t const remainingToFlush = ZSTDMT_flushProduced(mtctx, output, !forwardInputProgress, endOp); /* block if there was no forward input progress */
        if (input->pos < input->size) return MAX(remainingToFlush, 1);  /* input not consumed : do not end flush yet */
        DEBUGLOG(5, "end of ZSTDMT_compressStream_generic: remainingToFlush = %u", (U32)remainingToFlush);
        return remainingToFlush;
    }
}